

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O1

int decompress16(DUMBFILE *f,short *data,int len,int it215,int stereo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  short sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int in_EAX;
  uint uVar11;
  int iVar12;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  short *psVar19;
  uint bitwidth;
  ulong uVar20;
  bool bVar21;
  int iVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar41;
  int iVar43;
  undefined1 auVar42 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar46 [16];
  readblock_crap crap;
  ulong local_90;
  short *local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar9 = _DAT_00771ac0;
  auVar8 = _DAT_00771ab0;
  auVar7 = _DAT_00771aa0;
  auVar6 = _DAT_00771a90;
  auVar5 = _DAT_007140f0;
  local_90 = (ulong)(uint)len;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  if (0 < len) {
    in_EAX = stereo + 1;
    lVar13 = (long)in_EAX;
    lVar17 = local_90 - 1;
    auVar24._8_4_ = (int)lVar17;
    auVar24._0_8_ = lVar17;
    auVar24._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar20 = 0;
    auVar24 = auVar24 ^ _DAT_007140f0;
    psVar19 = data;
    do {
      auVar34._8_4_ = (int)uVar20;
      auVar34._0_8_ = uVar20;
      auVar34._12_4_ = (int)(uVar20 >> 0x20);
      auVar26 = (auVar34 | auVar9) ^ auVar5;
      iVar35 = auVar24._0_4_;
      iVar41 = -(uint)(iVar35 < auVar26._0_4_);
      iVar22 = auVar24._4_4_;
      auVar27._4_4_ = -(uint)(iVar22 < auVar26._4_4_);
      iVar40 = auVar24._8_4_;
      iVar43 = -(uint)(iVar40 < auVar26._8_4_);
      iVar16 = auVar24._12_4_;
      auVar27._12_4_ = -(uint)(iVar16 < auVar26._12_4_);
      auVar37._4_4_ = iVar41;
      auVar37._0_4_ = iVar41;
      auVar37._8_4_ = iVar43;
      auVar37._12_4_ = iVar43;
      auVar44 = pshuflw(in_XMM11,auVar37,0xe8);
      auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar22);
      auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar16);
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar46 = pshuflw(in_XMM12,auVar29,0xe8);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar45 = pshuflw(auVar44,auVar27,0xe8);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar26 = (auVar45 | auVar46 & auVar44) ^ auVar26;
      auVar26 = packssdw(auVar26,auVar26);
      if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *psVar19 = 0;
      }
      auVar27 = auVar29 & auVar37 | auVar27;
      auVar26 = packssdw(auVar27,auVar27);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar26 = packssdw(auVar26 ^ auVar45,auVar26 ^ auVar45);
      if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
        psVar19[lVar13] = 0;
      }
      auVar26 = (auVar34 | auVar8) ^ auVar5;
      iVar41 = -(uint)(iVar35 < auVar26._0_4_);
      auVar42._4_4_ = -(uint)(iVar22 < auVar26._4_4_);
      iVar43 = -(uint)(iVar40 < auVar26._8_4_);
      auVar42._12_4_ = -(uint)(iVar16 < auVar26._12_4_);
      auVar28._4_4_ = iVar41;
      auVar28._0_4_ = iVar41;
      auVar28._8_4_ = iVar43;
      auVar28._12_4_ = iVar43;
      auVar36._4_4_ = -(uint)(auVar26._4_4_ == iVar22);
      auVar36._12_4_ = -(uint)(auVar26._12_4_ == iVar16);
      auVar36._0_4_ = auVar36._4_4_;
      auVar36._8_4_ = auVar36._12_4_;
      auVar42._0_4_ = auVar42._4_4_;
      auVar42._8_4_ = auVar42._12_4_;
      auVar26 = auVar36 & auVar28 | auVar42;
      auVar26 = packssdw(auVar26,auVar26);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar26 = packssdw(auVar26 ^ auVar1,auVar26 ^ auVar1);
      if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar19[lVar13 * 2] = 0;
      }
      auVar29 = pshufhw(auVar28,auVar28,0x84);
      auVar37 = pshufhw(auVar36,auVar36,0x84);
      auVar27 = pshufhw(auVar29,auVar42,0x84);
      auVar30._8_4_ = 0xffffffff;
      auVar30._0_8_ = 0xffffffffffffffff;
      auVar30._12_4_ = 0xffffffff;
      auVar30 = (auVar27 | auVar37 & auVar29) ^ auVar30;
      auVar29 = packssdw(auVar30,auVar30);
      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar19[lVar13 * 3] = 0;
      }
      auVar29 = (auVar34 | auVar7) ^ auVar5;
      iVar41 = -(uint)(iVar35 < auVar29._0_4_);
      auVar32._4_4_ = -(uint)(iVar22 < auVar29._4_4_);
      iVar43 = -(uint)(iVar40 < auVar29._8_4_);
      auVar32._12_4_ = -(uint)(iVar16 < auVar29._12_4_);
      auVar38._4_4_ = iVar41;
      auVar38._0_4_ = iVar41;
      auVar38._8_4_ = iVar43;
      auVar38._12_4_ = iVar43;
      auVar26 = pshuflw(auVar26,auVar38,0xe8);
      auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar22);
      auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar16);
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar29 = pshuflw(auVar46 & auVar44,auVar31,0xe8);
      in_XMM12 = auVar29 & auVar26;
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar26 = pshuflw(auVar26,auVar32,0xe8);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar26 | in_XMM12) ^ auVar44;
      in_XMM11 = packssdw(auVar44,auVar44);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar19[lVar13 * 4] = 0;
      }
      auVar32 = auVar31 & auVar38 | auVar32;
      auVar26 = packssdw(auVar32,auVar32);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar26 = packssdw(auVar26 ^ auVar46,auVar26 ^ auVar46);
      if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar19[lVar13 * 5] = 0;
      }
      auVar26 = (auVar34 | auVar6) ^ auVar5;
      iVar35 = -(uint)(iVar35 < auVar26._0_4_);
      auVar39._4_4_ = -(uint)(iVar22 < auVar26._4_4_);
      iVar40 = -(uint)(iVar40 < auVar26._8_4_);
      auVar39._12_4_ = -(uint)(iVar16 < auVar26._12_4_);
      auVar33._4_4_ = iVar35;
      auVar33._0_4_ = iVar35;
      auVar33._8_4_ = iVar40;
      auVar33._12_4_ = iVar40;
      auVar25._4_4_ = -(uint)(auVar26._4_4_ == iVar22);
      auVar25._12_4_ = -(uint)(auVar26._12_4_ == iVar16);
      auVar25._0_4_ = auVar25._4_4_;
      auVar25._8_4_ = auVar25._12_4_;
      auVar39._0_4_ = auVar39._4_4_;
      auVar39._8_4_ = auVar39._12_4_;
      auVar26 = auVar25 & auVar33 | auVar39;
      auVar26 = packssdw(auVar26,auVar26);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar26 = packssdw(auVar26 ^ auVar2,auVar26 ^ auVar2);
      if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar19[lVar13 * 6] = 0;
      }
      auVar34 = pshufhw(auVar33,auVar33,0x84);
      auVar26 = pshufhw(auVar25,auVar25,0x84);
      auVar29 = pshufhw(auVar34,auVar39,0x84);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar26 = packssdw(auVar26 & auVar34,(auVar29 | auVar26 & auVar34) ^ auVar3);
      if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar19[lVar13 * 7] = 0;
      }
      uVar20 = uVar20 + 8;
      psVar19 = psVar19 + lVar13 * 8;
    } while ((len + 7U & 0xfffffff8) != uVar20);
  }
  if (0 < len) {
    local_70 = data;
    while (in_EAX = readblock(f,(readblock_crap *)local_58), in_EAX == 0) {
      iVar22 = (int)local_90;
      iVar35 = 0x4000;
      if (iVar22 < 0x4000) {
        iVar35 = iVar22;
      }
      iVar40 = 1;
      if (1 < iVar35) {
        iVar40 = iVar35;
      }
      iVar16 = 0;
      uVar23 = 0x11;
      bVar21 = true;
      iVar41 = 0;
      iVar43 = 0;
      do {
        while( true ) {
          bVar14 = (byte)uVar23;
          bitwidth = uVar23 & 0xff;
          uVar11 = readbits(bitwidth,(readblock_crap *)local_58);
          uVar18 = (uint)local_90;
          if (6 < bVar14) break;
          if (uVar11 != 1 << (bVar14 - 1 & 0x1f)) goto LAB_006f4b69;
          iVar12 = readbits(4,(readblock_crap *)local_58);
          uVar10 = (uint)(byte)((char)iVar12 + 2);
          if ((int)(iVar12 + 1U) < (int)bitwidth) {
            uVar10 = iVar12 + 1U;
          }
LAB_006f4b5d:
          uVar23 = uVar10;
          if (!bVar21) goto LAB_006f4bd9;
        }
        if (0x10 < bVar14) {
          if (bVar14 != 0x11) {
            free((void *)local_58._0_8_);
            return extraout_EAX_00;
          }
          if ((uVar11 >> 0x10 & 1) == 0) goto LAB_006f4b69;
          uVar10 = uVar11 + 1;
          goto LAB_006f4b5d;
        }
        uVar15 = (0xffffU >> (0x11 - bVar14 & 0x1f)) + 0xfff8 & 0xffff;
        iVar12 = uVar11 - uVar15;
        uVar23 = bitwidth;
        uVar10 = iVar12 + (uint)((int)bitwidth <= iVar12);
        if ((int)uVar11 <= (int)(uVar15 + 0x10) && (iVar12 != 0 && (int)uVar15 <= (int)uVar11))
        goto LAB_006f4b5d;
LAB_006f4b69:
        if ((byte)uVar23 < 0x10) {
          bVar14 = 0x10 - (byte)uVar23;
          uVar11 = (int)(short)(uVar11 << (bVar14 & 0x1f)) >> (bVar14 & 0x1f);
        }
        iVar41 = iVar41 + uVar11;
        iVar16 = iVar16 + iVar41;
        sVar4 = (short)iVar16;
        if (it215 == 0) {
          sVar4 = (short)iVar41;
        }
        *local_70 = sVar4;
        local_70 = local_70 + (ulong)(uint)stereo + 1;
        local_90 = (ulong)(uVar18 - 1);
        iVar43 = iVar43 + 1;
        bVar21 = iVar43 < iVar35;
      } while (iVar43 != iVar40);
      local_90 = (ulong)(uint)(iVar22 - iVar40);
      uVar18 = iVar22 - iVar40;
LAB_006f4bd9:
      free((void *)local_58._0_8_);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_58._8_8_;
      local_58 = auVar5 << 0x40;
      if ((int)uVar18 < 1) {
        return extraout_EAX;
      }
    }
  }
  return in_EAX;
}

Assistant:

static int decompress16(DUMBFILE *f, short *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	int32 val;
	short d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for ( blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo )
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x4000) ? len : 0x4000; // Max block length is 0x4000 bytes
		blockpos = 0;
		bitwidth = 17;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			val = readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = readbits(4, &crap) + 1;
					bitwidth = (byte)((val < bitwidth) ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth < 17) { //Method 2
				word border = (0xFFFF >> (17 - bitwidth)) - 8;

				if (val > border && val <= (border + 16)) {
					val -= border;
					bitwidth = (byte)(val < bitwidth ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth == 17) { //Method 3
				if (val & 0x10000) {
					bitwidth = (byte)((val + 1) & 0xFF);
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				short v; //The sample value:
				if (bitwidth < 16) {
					byte shift = 16 - bitwidth;
					v = (short)(val << shift);
					v >>= shift;
				}
				else
					v = (short)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}